

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::RadixHTLocalSourceState::Scan
          (RadixHTLocalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTGlobalSourceState *gstate,DataChunk *chunk)

{
  DataChunk *result;
  Vector *addresses;
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  RadixPartitionedHashTable *pRVar3;
  size_type *psVar4;
  bool bVar5;
  reference this_00;
  type pAVar6;
  type this_01;
  reference pvVar7;
  reference pvVar8;
  _Base_ptr p_Var9;
  idx_t iVar10;
  const_reference value;
  _Rb_tree_header *p_Var11;
  GroupedAggregateData *this_02;
  size_type __n;
  size_type sVar12;
  ulong uVar13;
  size_type *psVar14;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_58;
  void *local_48 [3];
  
  this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::operator[](&sink->partitions,this->task_idx);
  pAVar6 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
           ::operator*(this_00);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&pAVar6->data);
  if (this->scan_status == INIT) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
               &(gstate->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    TupleDataCollection::InitializeScan
              (this_01,&this->scan_state,(vector<unsigned_long,_true> *)local_48,
               sink->scan_pin_properties);
    if (local_48[0] != (void *)0x0) {
      operator_delete(local_48[0]);
    }
    this->scan_status = IN_PROGRESS;
  }
  result = &this->scan_chunk;
  bVar5 = TupleDataCollection::Scan(this_01,&this->scan_state,result);
  if (bVar5) {
    addresses = &(this->scan_state).chunk_state.row_locations;
    RowOperations::FinalizeStates
              (&this->row_state,&this->layout,addresses,result,
               ((long)(this->layout).types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->layout).types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1);
    if ((sink->scan_pin_properties == DESTROY_AFTER_DONE) &&
       ((this->layout).aggr_destructor_idxs.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->layout).aggr_destructor_idxs.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      RowOperations::DestroyStates
                (&this->row_state,&this->layout,addresses,(this->scan_chunk).count);
    }
    pRVar3 = sink->radix_ht;
    p_Var9 = (pRVar3->grouping_set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(pRVar3->grouping_set->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var11) {
      sVar12 = 0;
      do {
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,*(size_type *)(p_Var9 + 1));
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar12);
        Vector::Reference(pvVar7,pvVar8);
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment(p_Var9);
        sVar12 = sVar12 + 1;
      } while ((_Rb_tree_header *)p_Var9 != p_Var11);
    }
    psVar4 = (pRVar3->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar14 = (pRVar3->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                   .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; psVar14 != psVar4; psVar14 = psVar14 + 1) {
      sVar12 = *psVar14;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar12);
      Vector::SetVectorType(pvVar7,CONSTANT_VECTOR);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar12);
      ConstantVector::SetNull(pvVar7,true);
    }
    this_02 = pRVar3->op;
    if ((this_02->aggregates).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_02->aggregates).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        iVar10 = GroupedAggregateData::GroupCount(this_02);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,iVar10 + uVar13);
        pvVar8 = vector<duckdb::Vector,_true>::operator[]
                           (&result->data,
                            ((long)(pRVar3->group_types).
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   .
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pRVar3->group_types).
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   .
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555 + uVar13);
        Vector::Reference(pvVar7,pvVar8);
        uVar13 = uVar13 + 1;
        this_02 = pRVar3->op;
      } while (uVar13 < (ulong)((long)(this_02->aggregates).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_02->aggregates).
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((this_02->grouping_functions).
        super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
        .
        super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_02->grouping_functions).
        super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
        .
        super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        iVar10 = GroupedAggregateData::GroupCount(this_02);
        pvVar7 = vector<duckdb::Vector,_true>::operator[]
                           (&chunk->data,
                            ((long)(pRVar3->op->aggregates).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pRVar3->op->aggregates).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) + iVar10 + __n);
        value = vector<duckdb::Value,_true>::operator[](&pRVar3->grouping_values,__n);
        Vector::Reference(pvVar7,value);
        this_02 = pRVar3->op;
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this_02->grouping_functions).
                                    super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_02->grouping_functions).
                                    super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
    }
    chunk->count = (this->scan_chunk).count;
  }
  else {
    if (sink->scan_pin_properties == DESTROY_AFTER_DONE) {
      TupleDataCollection::Reset(this_01);
    }
    this->scan_status = DONE;
    local_58._M_device = &(sink->super_GlobalSinkState).super_StateWithBlockableTasks.lock;
    local_58._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    LOCK();
    paVar1 = &gstate->task_done;
    _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (_Var2 + 1 ==
        (long)(sink->partitions).
              super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(sink->partitions).
              super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      LOCK();
      (gstate->finished)._M_base._M_i = true;
      UNLOCK();
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
  }
  return;
}

Assistant:

void RadixHTLocalSourceState::Scan(RadixHTGlobalSinkState &sink, RadixHTGlobalSourceState &gstate, DataChunk &chunk) {
	D_ASSERT(task == RadixHTSourceTaskType::SCAN);
	D_ASSERT(scan_status != RadixHTScanStatus::DONE);

	auto &partition = *sink.partitions[task_idx];
	D_ASSERT(partition.state == AggregatePartitionState::READY_TO_SCAN);
	auto &data_collection = *partition.data;

	if (scan_status == RadixHTScanStatus::INIT) {
		data_collection.InitializeScan(scan_state, gstate.column_ids, sink.scan_pin_properties);
		scan_status = RadixHTScanStatus::IN_PROGRESS;
	}

	if (!data_collection.Scan(scan_state, scan_chunk)) {
		if (sink.scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE) {
			data_collection.Reset();
		}
		scan_status = RadixHTScanStatus::DONE;
		auto guard = sink.Lock();
		if (++gstate.task_done == sink.partitions.size()) {
			gstate.finished = true;
		}
		return;
	}

	const auto group_cols = layout.ColumnCount() - 1;
	RowOperations::FinalizeStates(row_state, layout, scan_state.chunk_state.row_locations, scan_chunk, group_cols);

	if (sink.scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE && layout.HasDestructor()) {
		RowOperations::DestroyStates(row_state, layout, scan_state.chunk_state.row_locations, scan_chunk.size());
	}

	auto &radix_ht = sink.radix_ht;
	idx_t chunk_index = 0;
	for (auto &entry : radix_ht.grouping_set) {
		chunk.data[entry].Reference(scan_chunk.data[chunk_index++]);
	}
	for (auto null_group : radix_ht.null_groups) {
		chunk.data[null_group].SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(chunk.data[null_group], true);
	}
	D_ASSERT(radix_ht.grouping_set.size() + radix_ht.null_groups.size() == radix_ht.op.GroupCount());
	for (idx_t col_idx = 0; col_idx < radix_ht.op.aggregates.size(); col_idx++) {
		chunk.data[radix_ht.op.GroupCount() + col_idx].Reference(
		    scan_chunk.data[radix_ht.group_types.size() + col_idx]);
	}
	D_ASSERT(radix_ht.op.grouping_functions.size() == radix_ht.grouping_values.size());
	for (idx_t i = 0; i < radix_ht.op.grouping_functions.size(); i++) {
		chunk.data[radix_ht.op.GroupCount() + radix_ht.op.aggregates.size() + i].Reference(radix_ht.grouping_values[i]);
	}
	chunk.SetCardinality(scan_chunk);
	D_ASSERT(chunk.size() != 0);
}